

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O1

int sinfl_decode(uchar **in,uchar *end,sinfl *s,uint *tbl,int bit_len)

{
  uint uVar1;
  
  uVar1 = tbl[(uint)(~(-1 << ((byte)bit_len & 0x1f)) & s->bits)];
  if ((uVar1 & 0x10) != 0) {
    sinfl_get(in,end,s,bit_len);
    uVar1 = tbl[(uVar1 >> 0x10) + (~(-1 << ((byte)uVar1 & 0xf)) & s->bits)];
  }
  sinfl_get(in,end,s,uVar1 & 0xf);
  return uVar1 >> 0x10 & 0xfff;
}

Assistant:

static int
sinfl_decode(const unsigned char **in, const unsigned char *end,
             struct sinfl *s, const unsigned *tbl, int bit_len) {
  int idx = s->bits & ((1 << bit_len) - 1);
  unsigned key = tbl[idx];
  if (key & 0x10) {
    /* sub-table lookup */
    int len = key & 0x0f;
    sinfl_get(in, end, s, bit_len);
    idx = s->bits & ((1 << len)-1);
    key = tbl[((key >> 16) & 0xffff) + (unsigned)idx];
  }
  sinfl_get(in, end, s, key & 0x0f);
  return (key >> 16) & 0x0fff;
}